

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkMan.c
# Opt level: O2

void Lpk_ManStop(Lpk_Man_t *p)

{
  uint *__ptr;
  If_Man_t *p_00;
  If_Par_t *__ptr_00;
  long lVar1;
  
  __ptr = p->ppTruths[0][0];
  if (__ptr != (uint *)0x0) {
    free(__ptr);
    p->ppTruths[0][0] = (uint *)0x0;
  }
  Vec_IntFree(p->vBddDir);
  Vec_IntFree(p->vBddInv);
  Vec_IntFree(p->vMemory);
  Kit_DsdManFree(p->pDsdMan);
  for (lVar1 = 0x3689; lVar1 != 0x3691; lVar1 = lVar1 + 1) {
    Vec_IntFree(*(Vec_Int_t **)(p->pCuts[0].uSign + lVar1 * 2 + -0xb));
  }
  p_00 = p->pIfMan;
  if (p_00 != (If_Man_t *)0x0) {
    __ptr_00 = p_00->pPars;
    If_ManStop(p_00);
    free(__ptr_00);
  }
  if (p->vLevels != (Vec_Vec_t *)0x0) {
    Vec_VecFree(p->vLevels);
  }
  if (p->vVisited != (Vec_Vec_t *)0x0) {
    Vec_VecFree(p->vVisited);
  }
  Vec_PtrFree(p->vLeaves);
  Vec_IntFree(p->vCover);
  Vec_PtrFree(p->vTtElems);
  Vec_PtrFree(p->vTtNodes);
  free(p);
  return;
}

Assistant:

void Lpk_ManStop( Lpk_Man_t * p )
{
    int i;
    ABC_FREE( p->ppTruths[0][0] );
    Vec_IntFree( p->vBddDir );
    Vec_IntFree( p->vBddInv );
    Vec_IntFree( p->vMemory );
    Kit_DsdManFree( p->pDsdMan );
    for ( i = 0; i < 8; i++ )
        Vec_IntFree(p->vSets[i]);
    if ( p->pIfMan )
    {
        void * pPars = p->pIfMan->pPars;
        If_ManStop( p->pIfMan );
        ABC_FREE( pPars );
    }
    if ( p->vLevels )
        Vec_VecFree( p->vLevels );
    if ( p->vVisited )
        Vec_VecFree( p->vVisited );
    Vec_PtrFree( p->vLeaves );
    Vec_IntFree( p->vCover );
    Vec_PtrFree( p->vTtElems );
    Vec_PtrFree( p->vTtNodes );
    ABC_FREE( p );
}